

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O1

void __thiscall
taylor<double,1,12>::shift<6,double>(taylor<double,1,12> *this,taylor<double,_1,_6> *out,double *dx)

{
  long lVar1;
  double dVar2;
  double dVar3;
  int i;
  int iVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  int iVar10;
  int i_1;
  double dVar11;
  double dxpow [13];
  double adStack_c8 [19];
  
  (out->super_polynomial<double,_1,_6>).c[4] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[5] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[2] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[3] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[0] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[1] = 0.0;
  (out->super_polynomial<double,_1,_6>).c[6] = 0.0;
  adStack_c8[6] = 1.0;
  dVar2 = *dx;
  lVar5 = 1;
  dVar11 = 1.0;
  do {
    dVar11 = dVar11 * dVar2;
    adStack_c8[lVar5 + 6] = dVar11;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xd);
  iVar10 = 1;
  lVar5 = 0;
  do {
    lVar8 = 0;
    lVar9 = lVar5;
    do {
      dVar2 = 1.0;
      if (lVar9 - lVar5 != 0) {
        iVar4 = 1;
        lVar7 = 0;
        do {
          lVar1 = lVar7 + 1;
          iVar4 = (((int)lVar7 + iVar10) * iVar4) / (int)lVar1;
          lVar7 = lVar1;
        } while (lVar8 != lVar1);
        dVar2 = (double)iVar4;
      }
      dVar11 = adStack_c8[(lVar9 - lVar5) + 6];
      pdVar6 = taylor<double,_1,_12>::operator[]((taylor<double,_1,_12> *)this,(int)lVar9);
      dVar3 = *pdVar6;
      pdVar6 = taylor<double,_1,_6>::operator[](out,(int)lVar5);
      *pdVar6 = dVar2 * dVar11 * dVar3 + *pdVar6;
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar9 != 0xd);
    lVar5 = lVar5 + 1;
    iVar10 = iVar10 + 1;
  } while (lVar5 != 7);
  return;
}

Assistant:

void shift(taylor<Tout, 1, NdegOut> & out, const Tout dx[Nvar]) const {
    assert(Nvar == 1);
    assert(NdegOut <= Ndeg);
    T dxpow[Ndeg + 1];
    out = 0;
    dxpow[0] = 1;
    for (int i = 1; i <= Ndeg; i++)
      dxpow[i] = dx[0] * dxpow[i - 1];
    for (int i = 0; i <= NdegOut; i++)
      for (int j = i; j <= Ndeg; j++)
        out[i] += taylorlen(j - i, i) * dxpow[j - i] * (*this)[j];
  }